

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsAppsExport.cpp
# Opt level: O3

void helicsAppLoadFile(HelicsApp app,char *configFile,HelicsError *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  App *this;
  AppObject *pAVar2;
  size_t sVar3;
  string local_40;
  
  pAVar2 = helics::getAppObject(app,err);
  if ((pAVar2 != (AppObject *)0x0) &&
     (this = (pAVar2->app).super___shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     this != (App *)0x0)) {
    paVar1 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    if (configFile == (char *)0x0) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                 gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
                 gHelicsEmptyStr_abi_cxx11_._M_string_length);
    }
    else {
      sVar3 = strlen(configFile);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,configFile,configFile + sVar3);
    }
    helics::apps::App::loadFile(this,&local_40,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void helicsAppLoadFile(HelicsApp app, const char* configFile, HelicsError* err)
{
    auto* happ = getApp(app, err);
    if (happ == nullptr) {
        return;
    }
    try {
        happ->loadFile(AS_STRING(configFile));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}